

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

bool check_interaction_settings_collision(options_i *options,string *file_options)

{
  bool bVar1;
  long *plVar2;
  byte bVar3;
  long lVar4;
  char *in_RSI;
  long *in_RDI;
  bool bVar5;
  bool file_options_has_interaction;
  bool command_line_has_interaction;
  bool local_134;
  byte local_ea;
  allocator local_c9;
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  long *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  local_a2 = 0;
  local_a3 = 0;
  bVar1 = false;
  bVar5 = false;
  std::__cxx11::string::string(local_40,"q",&local_41);
  bVar3 = (**(code **)(*in_RDI + 8))(in_RDI,local_40);
  plVar2 = local_10;
  local_ea = 1;
  if ((bVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string(local_78,"quadratic",&local_79);
    local_7b = 1;
    bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_78);
    plVar2 = local_10;
    local_ea = 1;
    if ((bVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string(local_a0,"cubic",&local_a1);
      local_a3 = 1;
      bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_a0);
      local_ea = 1;
      if ((bVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        bVar1 = true;
        std::__cxx11::string::string(local_c8,"interactions",&local_c9);
        bVar5 = true;
        local_ea = (**(code **)(*local_10 + 8))(local_10,local_c8);
      }
    }
  }
  if (bVar5) {
    std::__cxx11::string::~string(local_c8);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_19 = local_ea & 1;
  if (local_19 == 0) {
    local_1 = false;
  }
  else {
    lVar4 = std::__cxx11::string::find(in_RSI,0x3de688);
    bVar5 = true;
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find(in_RSI,0x3de694);
      bVar5 = lVar4 != -1;
    }
    local_134 = true;
    if (!bVar5) {
      lVar4 = std::__cxx11::string::find(in_RSI,0x3de69c);
      local_134 = lVar4 != -1;
    }
    local_1 = local_134;
  }
  return local_1;
}

Assistant:

bool check_interaction_settings_collision(options_i& options, std::string file_options)
{
  bool command_line_has_interaction = options.was_supplied("q") || options.was_supplied("quadratic") ||
      options.was_supplied("cubic") || options.was_supplied("interactions");

  if (!command_line_has_interaction)
    return false;

  // we don't use -q to save pairs in all.file_options, so only 3 options checked
  bool file_options_has_interaction = file_options.find("--quadratic") != std::string::npos;
  file_options_has_interaction = file_options_has_interaction || (file_options.find("--cubic") != std::string::npos);
  file_options_has_interaction =
      file_options_has_interaction || (file_options.find("--interactions") != std::string::npos);

  return file_options_has_interaction;
}